

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::exception::~exception(exception *this)

{
  ~exception(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~exception() override = default;